

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

void mi_commit_mask_create(size_t bitidx,size_t bitcount,mi_commit_mask_t *cm)

{
  ulong uVar1;
  ulong uVar2;
  size_t *psVar3;
  size_t sVar4;
  
  if (bitcount == 0) {
    mi_commit_mask_create_empty(cm);
    return;
  }
  if (bitcount == 0x200) {
    mi_commit_mask_create_full(cm);
    return;
  }
  mi_commit_mask_create_empty(cm);
  uVar1 = (ulong)((uint)bitidx & 0x3f);
  psVar3 = cm->mask + (bitidx >> 6);
  for (; bitcount != 0; bitcount = bitcount - uVar2) {
    uVar2 = 0x40 - uVar1;
    if (bitcount < 0x40 - uVar1) {
      uVar2 = bitcount;
    }
    sVar4 = ~(-1L << ((byte)uVar2 & 0x3f)) << (sbyte)uVar1;
    if (0x3f < uVar2) {
      sVar4 = 0xffffffffffffffff;
    }
    *psVar3 = sVar4;
    psVar3 = psVar3 + 1;
    uVar1 = 0;
  }
  return;
}

Assistant:

static void mi_commit_mask_create(size_t bitidx, size_t bitcount, mi_commit_mask_t* cm) {
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  if (bitcount == MI_COMMIT_MASK_BITS) {
    mi_assert_internal(bitidx==0);
    mi_commit_mask_create_full(cm);
  }
  else if (bitcount == 0) {
    mi_commit_mask_create_empty(cm);
  }
  else {
    mi_commit_mask_create_empty(cm);
    size_t i = bitidx / MI_COMMIT_MASK_FIELD_BITS;
    size_t ofs = bitidx % MI_COMMIT_MASK_FIELD_BITS;
    while (bitcount > 0) {
      mi_assert_internal(i < MI_COMMIT_MASK_FIELD_COUNT);
      size_t avail = MI_COMMIT_MASK_FIELD_BITS - ofs;
      size_t count = (bitcount > avail ? avail : bitcount);
      size_t mask = (count >= MI_COMMIT_MASK_FIELD_BITS ? ~((size_t)0) : (((size_t)1 << count) - 1) << ofs);
      cm->mask[i] = mask;
      bitcount -= count;
      ofs = 0;
      i++;
    }
  }
}